

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_array.c
# Opt level: O3

void garray_const(_garray *x,t_floatarg g)

{
  undefined1 auVar1 [16];
  _array *p_Var2;
  ulong uVar3;
  long lVar4;
  t_floatarg *ptVar5;
  long lVar6;
  int iVar8;
  undefined1 auVar7 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iVar12;
  int elemsize;
  int yonset;
  int local_10;
  int local_c;
  
  p_Var2 = garray_getarray_floatonly(x,&local_c,&local_10);
  auVar1 = _DAT_001b53a0;
  if (p_Var2 == (_array *)0x0) {
    pd_error((void *)0x0,"%s: needs floating-point \'y\' field",x->x_realname->s_name);
  }
  else {
    iVar8 = p_Var2->a_n;
    if (0 < (long)iVar8) {
      lVar4 = (long)local_10;
      ptVar5 = (t_floatarg *)(p_Var2->a_vec + (long)local_c * 4);
      uVar3 = (ulong)(iVar8 + 3U & 0xfffffffc);
      lVar6 = (long)iVar8 + -1;
      auVar7._8_4_ = (int)lVar6;
      auVar7._0_8_ = lVar6;
      auVar7._12_4_ = (int)((ulong)lVar6 >> 0x20);
      auVar7 = auVar7 ^ _DAT_001b53a0;
      auVar9 = _DAT_001b5380;
      auVar10 = _DAT_001b5390;
      do {
        auVar11 = auVar10 ^ auVar1;
        iVar8 = auVar7._4_4_;
        if ((bool)(~(auVar11._4_4_ == iVar8 && auVar7._0_4_ < auVar11._0_4_ || iVar8 < auVar11._4_4_
                    ) & 1)) {
          *ptVar5 = g;
        }
        if ((auVar11._12_4_ != auVar7._12_4_ || auVar11._8_4_ <= auVar7._8_4_) &&
            auVar11._12_4_ <= auVar7._12_4_) {
          *(t_floatarg *)((long)ptVar5 + lVar4) = g;
        }
        auVar11 = auVar9 ^ auVar1;
        iVar12 = auVar11._4_4_;
        if (iVar12 <= iVar8 && (iVar12 != iVar8 || auVar11._0_4_ <= auVar7._0_4_)) {
          *(t_floatarg *)((long)ptVar5 + lVar4 * 2) = g;
          *(t_floatarg *)((long)ptVar5 + lVar4 * 3) = g;
        }
        lVar6 = auVar10._8_8_;
        auVar10._0_8_ = auVar10._0_8_ + 4;
        auVar10._8_8_ = lVar6 + 4;
        lVar6 = auVar9._8_8_;
        auVar9._0_8_ = auVar9._0_8_ + 4;
        auVar9._8_8_ = lVar6 + 4;
        ptVar5 = ptVar5 + lVar4;
        uVar3 = uVar3 - 4;
      } while (uVar3 != 0);
    }
  }
  garray_redraw(x);
  return;
}

Assistant:

static void garray_const(t_garray *x, t_floatarg g)
{
    int yonset, i, elemsize;
    t_array *array = garray_getarray_floatonly(x, &yonset, &elemsize);
    if (!array)
        pd_error(0, "%s: needs floating-point 'y' field", x->x_realname->s_name);
    else for (i = 0; i < array->a_n; i++)
        *((t_float *)((char *)array->a_vec
            + elemsize * i) + yonset) = g;
    garray_redraw(x);
}